

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O3

void receive_poll(PtTimestamp timestamp,void *userData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  PmEvent in_RAX;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  char *__s;
  uint uVar9;
  PmEvent event;
  PmEvent local_18;
  
  if (receive_poll_running != '\x01') {
    return;
  }
  local_18 = in_RAX;
  do {
    iVar3 = Pm_Read(receive_msg_midi_in,&local_18,1);
    if (iVar3 == 0) {
      return;
    }
    uVar4 = (ulong)receive_msg_index;
    uVar7 = 0x3ff;
    if (0x3ff < receive_msg_index) {
      uVar7 = (ulong)(uint)receive_msg_index;
    }
    iVar3 = 0;
    uVar5 = 0;
    do {
      uVar9 = local_18.message >> ((byte)uVar5 & 0x1f);
      receive_msg[uVar4] = (uchar)uVar9;
      if (uVar7 == uVar4) {
        receive_msg_index = (receive_msg_index - iVar3) + 1;
        __s = "error: incoming sysex too long";
        goto LAB_0010465f;
      }
      uVar9 = uVar9 & 0xff;
      iVar3 = iVar3 + -1;
      if (0x17 < uVar5) break;
      uVar5 = uVar5 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar9 != 0xf7);
    receive_msg_index = receive_msg_index - iVar3;
  } while (uVar9 != 0xf7);
  iVar3 = receive_msg_index;
  if ((receive_msg_length == 0) ||
     (iVar3 = receive_msg_length, receive_msg_length == receive_msg_index)) {
    receive_msg_length = iVar3;
    if (receive_msg[0] == 0xf0) {
      lVar6 = 0;
      puVar8 = receive_msg;
      iVar3 = 0;
      do {
        puVar8 = puVar8 + 1;
        iVar3 = iVar3 + ((uint)*puVar8 << ((byte)lVar6 & 0x1f));
        lVar6 = lVar6 + 7;
      } while (lVar6 != 0x23);
      iVar1 = iVar3;
      iVar2 = iVar3;
      if ((receive_msg_count == -1) ||
         (iVar1 = receive_msg_count, iVar2 = receive_msg_messages, receive_msg_count == iVar3)) {
        receive_msg_messages = iVar2;
        receive_msg_count = iVar1;
        if (7 < receive_msg_index) {
          uVar4 = 6;
          __s = "error: incoming sysex has bad data";
          do {
            if (((uint)uVar4 & 0x7f) != (uint)receive_msg[uVar4]) goto LAB_0010465f;
            uVar4 = uVar4 + 1;
          } while (receive_msg_index - 1U != uVar4);
        }
        if (receive_msg[(int)(receive_msg_index - 1U)] != 0xf7) {
          receive_msg_error = 1;
          return;
        }
        receive_msg_index = 0;
        receive_msg_count = iVar3 + -1;
        return;
      }
      __s = "error: incoming sysex has wrong count";
    }
    else {
      __s = "error: incoming sysex missing status byte";
    }
  }
  else {
    __s = "error: incoming sysex wrong length";
  }
LAB_0010465f:
  puts(__s);
  receive_msg_error = 1;
  return;
}

Assistant:

void receive_poll(PtTimestamp timestamp, void *userData)
{
    PmError count;
    PmEvent event;
    int shift;
    int data = 0;
    int i;
    
    if (!receive_poll_running) return; /* wait until midi device is opened */
    shift = 0;
    while (data != MIDI_EOX) {
        count = Pm_Read(receive_msg_midi_in, &event, 1);
        if (count == 0) return;

        /* compare 4 bytes of data until you reach an eox */
        for (shift = 0; shift < 32 && (data != MIDI_EOX); shift += 8) {
            receive_msg[receive_msg_index++] = data = 
                (event.message >> shift) & 0xFF;
            if (receive_msg_index >= MAX_MSG_LEN) {
                printf("error: incoming sysex too long\n");
                goto error;
            }
        }
    }
    /* check the message */
    if (receive_msg_length == 0) {
        receive_msg_length = receive_msg_index;
    }
    if (receive_msg_length != receive_msg_index) {
        printf("error: incoming sysex wrong length\n");
        goto error;
    }
    if (receive_msg[0] != MIDI_SYSEX) {
        printf("error: incoming sysex missing status byte\n");
        goto error;
    }
    /* get and check the count */
    count = 0;
    for (i = 0; i < 5; i++) {
        count += receive_msg[i + 1] << (7 * i);
    }
    if (receive_msg_count == -1) {
        receive_msg_count = count;
        receive_msg_messages = count;
    }
    if (receive_msg_count != count) {
        printf("error: incoming sysex has wrong count\n");
        goto error;
    }
    for (i = 6; i < receive_msg_index - 1; i++) {
        if (receive_msg[i] != i % 128) {
            printf("error: incoming sysex has bad data\n");
            goto error;
        }
    }
    if (receive_msg[receive_msg_length - 1] != MIDI_EOX) goto error;
    receive_msg_index = 0; /* get ready for next message */
    receive_msg_count--;
    return;
 error:
    receive_msg_error = 1;
    return;
}